

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce_load_size.h
# Opt level: O3

Analysis __thiscall spvtools::opt::ReduceLoadSize::GetPreservedAnalyses(ReduceLoadSize *this)

{
  return kAnalysisTypes|kAnalysisConstants|kAnalysisNameMap|kAnalysisLoopAnalysis|
         kAnalysisDominatorAnalysis|kAnalysisCFG|kAnalysisCombinators|kAnalysisInstrToBlockMapping|
         kAnalysisBegin;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisCombinators | IRContext::kAnalysisCFG |
           IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisNameMap |
           IRContext::kAnalysisConstants | IRContext::kAnalysisTypes;
  }